

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

xmlEntityPtr xmlGetParameterEntity(xmlDocPtr doc,xmlChar *name)

{
  xmlEntityPtr ret;
  xmlEntitiesTablePtr table;
  xmlChar *name_local;
  xmlDocPtr doc_local;
  
  if (doc == (xmlDocPtr)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else if (((doc->intSubset == (_xmlDtd *)0x0) || (doc->intSubset->pentities == (void *)0x0)) ||
          (doc_local = (xmlDocPtr)
                       xmlGetEntityFromTable((xmlEntitiesTablePtr)doc->intSubset->pentities,name),
          doc_local == (xmlDocPtr)0x0)) {
    if ((doc->extSubset == (_xmlDtd *)0x0) || (doc->extSubset->pentities == (void *)0x0)) {
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      doc_local = (xmlDocPtr)
                  xmlGetEntityFromTable((xmlEntitiesTablePtr)doc->extSubset->pentities,name);
    }
  }
  return (xmlEntityPtr)doc_local;
}

Assistant:

xmlEntityPtr
xmlGetParameterEntity(xmlDocPtr doc, const xmlChar *name) {
    xmlEntitiesTablePtr table;
    xmlEntityPtr ret;

    if (doc == NULL)
	return(NULL);
    if ((doc->intSubset != NULL) && (doc->intSubset->pentities != NULL)) {
	table = (xmlEntitiesTablePtr) doc->intSubset->pentities;
	ret = xmlGetEntityFromTable(table, name);
	if (ret != NULL)
	    return(ret);
    }
    if ((doc->extSubset != NULL) && (doc->extSubset->pentities != NULL)) {
	table = (xmlEntitiesTablePtr) doc->extSubset->pentities;
	return(xmlGetEntityFromTable(table, name));
    }
    return(NULL);
}